

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_0::addDefaultPrograms
               (SourceCollections *programCollection,TessPrimitiveType primitiveType,
               SpacingMode spacingMode,WindingUsage windingUsage,PointModeUsage pointModeUsage,
               bool mirrorCoords)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  ostringstream *this;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  pointer pWVar11;
  bool bVar12;
  allocator<char> local_42d;
  TessPrimitiveType local_42c;
  ulong local_428;
  ulong local_420;
  SourceCollections *local_418;
  vector<bool,_std::allocator<bool>_> usePointModeCases;
  undefined1 local_3e8 [40];
  ulong local_3c0;
  string perVertexInterfaceBlock;
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  string local_380;
  string local_360;
  string local_340;
  ostringstream tessEvalCoordSrc;
  ostringstream src_2;
  string local_1a0 [368];
  
  local_420 = CONCAT44(local_420._4_4_,spacingMode);
  local_418 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessEvalCoordSrc);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&tessEvalCoordSrc,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usePointModeCases,"vert",(allocator<char> *)&perVertexInterfaceBlock);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_418->glslSources,(string *)&usePointModeCases);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)&src_2,(string *)local_3e8);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src_2);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)local_3e8);
  std::__cxx11::string::~string((string *)&usePointModeCases);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalCoordSrc);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessEvalCoordSrc);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&tessEvalCoordSrc,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(vertices = 1) out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usePointModeCases,"tesc",(allocator<char> *)&perVertexInterfaceBlock);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_418->glslSources,(string *)&usePointModeCases);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&src_2,(string *)local_3e8);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src_2);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)local_3e8);
  std::__cxx11::string::~string((string *)&usePointModeCases);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalCoordSrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&perVertexInterfaceBlock,
             "VertexData {\n    vec4 in_gs_tessCoord;\n    int  in_gs_primitiveID;\n}",
             (allocator<char> *)&tessEvalCoordSrc);
  this = (ostringstream *)&tessEvalCoordSrc;
  std::__cxx11::ostringstream::ostringstream(this);
  if (mirrorCoords) {
    if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      poVar4 = std::operator<<((ostream *)&tessEvalCoordSrc,"    float x = gl_TessCoord.x;\n");
      poVar4 = std::operator<<(poVar4,"    float y = gl_TessCoord.y;\n");
      poVar4 = std::operator<<(poVar4,"    float z = gl_TessCoord.z;\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
                              );
      poVar4 = std::operator<<(poVar4,
                               "    ib_out.in_gs_tessCoord   = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
                              );
      poVar4 = std::operator<<(poVar4,
                               "                             : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
                              );
      this = (ostringstream *)
             std::operator<<(poVar4,
                             "                             : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
                            );
      pcVar3 = "                             : vec4(x, y, z, 0.0);\n";
    }
    else {
      if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
        poVar4 = std::operator<<((ostream *)&tessEvalCoordSrc,"    float x = gl_TessCoord.x;\n");
        poVar4 = std::operator<<(poVar4,"    float y = gl_TessCoord.y;\n");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,
                                 "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
                                );
        poVar4 = std::operator<<(poVar4,
                                 "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
                                );
        pcVar3 = 
        "                             : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
        ;
      }
      else {
        if (primitiveType != TESSPRIMITIVETYPE_ISOLINES) goto LAB_00706842;
        poVar4 = std::operator<<((ostream *)&tessEvalCoordSrc,"    float x = gl_TessCoord.x;\n");
        poVar4 = std::operator<<(poVar4,"    float y = gl_TessCoord.y;\n");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,
                                 "    // Mirror one half of each outer edge onto the other half\n");
        pcVar3 = 
        "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
        ;
      }
      this = (ostringstream *)std::operator<<(poVar4,pcVar3);
      pcVar3 = "                             : vec4(x, y, 0.0, 0.0);\n";
    }
  }
  else {
    pcVar3 = "    ib_out.in_gs_tessCoord   = vec4(gl_TessCoord, 0.0);\n";
  }
  std::operator<<((ostream *)this,pcVar3);
  getWindingCases(&windingCases,windingUsage);
  usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  bVar12 = true;
  if (pointModeUsage == POINT_MODE_USAGE_VARY) {
    std::vector<bool,_std::allocator<bool>_>::push_back(&usePointModeCases,false);
  }
  else if (pointModeUsage != POINT_MODE_USAGE_USE) {
    bVar12 = false;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back(&usePointModeCases,bVar12);
  local_3c0 = local_420 & 0xffffffff;
  local_42c = primitiveType;
  local_428 = (ulong)primitiveType;
  for (pWVar11 = windingCases.
                 super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pWVar11 !=
      windingCases.
      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>.
      _M_impl.super__Vector_impl_data._M_finish; pWVar11 = pWVar11 + 1) {
    uVar6 = 0;
    puVar7 = usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    while ((uVar9 = (uint)uVar6,
           puVar7 != usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p ||
           (uVar9 != usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&src_2);
      pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      poVar4 = std::operator<<((ostream *)&src_2,pcVar3);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"layout(");
      if (local_42c < TESSPRIMITIVETYPE_LAST) {
        pcVar3 = (char *)(&DAT_00bdb9b8)[local_428];
      }
      else {
        pcVar3 = (char *)0x0;
      }
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,", ");
      if ((uint)local_420 < 3) {
        pcVar3 = (&PTR_anon_var_dwarf_fa11a3_00bdb9d0)[local_3c0];
      }
      else {
        pcVar3 = (char *)0x0;
      }
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,", ");
      pcVar3 = (char *)0x0;
      if (*pWVar11 == WINDING_CW) {
        pcVar3 = "cw";
      }
      if (*pWVar11 == WINDING_CCW) {
        pcVar3 = "ccw";
      }
      poVar4 = std::operator<<(poVar4,pcVar3);
      pcVar3 = ", point_mode";
      if ((*puVar7 >> (uVar6 & 0x3f) & 1) == 0) {
        pcVar3 = "";
      }
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,") in;\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"layout(location = 0) out ");
      poVar4 = std::operator<<(poVar4,(string *)&perVertexInterfaceBlock);
      poVar4 = std::operator<<(poVar4," ib_out;\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"void main (void)\n");
      poVar4 = std::operator<<(poVar4,"{\n");
      std::__cxx11::stringbuf::str();
      poVar4 = std::operator<<(poVar4,(string *)local_3e8);
      poVar4 = std::operator<<(poVar4,"    ib_out.in_gs_primitiveID = gl_PrimitiveID;\n");
      std::operator<<(poVar4,"}\n");
      std::__cxx11::string::~string((string *)local_3e8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"tese",&local_42d);
      getProgramName(&local_340,&local_360,*pWVar11,(*puVar7 & 1L << ((byte)uVar6 & 0x3f)) != 0);
      pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_418->glslSources,&local_340)
      ;
      std::__cxx11::stringbuf::str();
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)local_3e8,&local_380);
      glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_3e8);
      std::__cxx11::string::~string((string *)(local_3e8 + 8));
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src_2);
      puVar7 = puVar7 + (uVar9 == 0x3f);
      uVar1 = uVar9 + 1;
      if (uVar9 == 0x3f) {
        uVar1 = 0;
      }
      uVar6 = (ulong)uVar1;
    }
  }
  local_428 = local_428 << 2;
  uVar6 = 0;
  puVar7 = usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  while ((puVar7 != usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p ||
         ((uint)uVar6 !=
          usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset))) {
    uVar8 = 1L << ((byte)uVar6 & 0x3f);
    local_420 = uVar6;
    iVar2 = numVerticesPerPrimitive(local_42c,(*puVar7 >> (uVar6 & 0x3f) & 1) != 0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src_2);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar4 = std::operator<<((ostream *)&src_2,pcVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"#extension GL_EXT_geometry_shader : require\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"layout(");
    pcVar3 = (char *)(*puVar7 & uVar8);
    bVar12 = pcVar3 != (char *)0x0;
    if (bVar12) {
      pcVar3 = "points";
    }
    if (!bVar12 && local_42c < TESSPRIMITIVETYPE_LAST) {
      pcVar3 = &DAT_009be194 + *(int *)(&DAT_009be194 + local_428);
    }
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,") in;\n");
    poVar4 = std::operator<<(poVar4,"layout(");
    pcVar3 = (char *)(*puVar7 & uVar8);
    bVar12 = pcVar3 != (char *)0x0;
    if (bVar12) {
      pcVar3 = "points";
    }
    if (!bVar12 && local_42c < TESSPRIMITIVETYPE_LAST) {
      pcVar3 = &DAT_009be1a0 + *(int *)(&DAT_009be1a0 + local_428);
    }
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,", max_vertices = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") out;\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"layout(location = 0) in ");
    poVar4 = std::operator<<(poVar4,(string *)&perVertexInterfaceBlock);
    poVar4 = std::operator<<(poVar4," ib_in[];\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"struct PerPrimitive {\n");
    poVar4 = std::operator<<(poVar4,"    int  patchPrimitiveID;\n");
    poVar4 = std::operator<<(poVar4,"    int  primitiveID;\n");
    poVar4 = std::operator<<(poVar4,"    vec4 tessCoord[3];\n");
    poVar4 = std::operator<<(poVar4,"};\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,
                             "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                            );
    poVar4 = std::operator<<(poVar4,"    int          numPrimitives;\n");
    poVar4 = std::operator<<(poVar4,"    PerPrimitive primitive[];\n");
    poVar4 = std::operator<<(poVar4,"} sb_out;\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"void main (void)\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"    int index = atomicAdd(sb_out.numPrimitives, 1);\n");
    poVar4 = std::operator<<(poVar4,
                             "    sb_out.primitive[index].patchPrimitiveID = ib_in[0].in_gs_primitiveID;\n"
                            );
    std::operator<<(poVar4,"    sb_out.primitive[index].primitiveID      = index;\n");
    iVar10 = 0;
    if (iVar2 < 1) {
      iVar2 = iVar10;
    }
    for (; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      poVar4 = std::operator<<((ostream *)&src_2,"    sb_out.primitive[index].tessCoord[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar10);
      poVar4 = std::operator<<(poVar4,"]     = ib_in[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar10);
      std::operator<<(poVar4,"].in_gs_tessCoord;\n");
    }
    while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
      poVar4 = std::operator<<((ostream *)&src_2,"\n");
      poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(0.0);\n");
      std::operator<<(poVar4,"    EmitVertex();\n");
    }
    std::operator<<((ostream *)&src_2,"}\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"geom",&local_42d);
    getProgramName(&local_340,&local_360,(*puVar7 & uVar8) != 0);
    pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_418->glslSources,&local_340);
    std::__cxx11::stringbuf::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)local_3e8,&local_380);
    glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_3e8);
    std::__cxx11::string::~string((string *)(local_3e8 + 8));
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src_2);
    iVar2 = (int)local_420;
    uVar6 = (ulong)(iVar2 + 1);
    if (iVar2 == 0x3f) {
      uVar6 = 0;
    }
    puVar7 = puVar7 + (iVar2 == 0x3f);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&usePointModeCases.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::
  ~_Vector_base(&windingCases.
                 super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
               );
LAB_00706842:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalCoordSrc);
  std::__cxx11::string::~string((string *)&perVertexInterfaceBlock);
  return;
}

Assistant:

void addDefaultPrograms (vk::SourceCollections&  programCollection,
						 const TessPrimitiveType primitiveType,
						 const SpacingMode       spacingMode,
						 const WindingUsage      windingUsage,
						 const PointModeUsage    pointModeUsage,
						 const bool				 mirrorCoords = false)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	const std::string perVertexInterfaceBlock = \
		"VertexData {\n"					// no in/out qualifier
		"    vec4 in_gs_tessCoord;\n"		// w component is used by mirroring test
		"    int  in_gs_primitiveID;\n"
		"}";								// no newline nor semicolon

	// Alternative tess coordinates handling code
	std::ostringstream tessEvalCoordSrc;
	if (mirrorCoords)
		switch (primitiveType)
		{
			case TESSPRIMITIVETYPE_TRIANGLES:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "    float z = gl_TessCoord.z;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
								 << "    ib_out.in_gs_tessCoord   = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
								 << "                             : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
								 << "                             : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
								 << "                             : vec4(x, y, z, 0.0);\n";
				break;
			case TESSPRIMITIVETYPE_QUADS:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
								 << "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
								 << "                             : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
								 << "                             : vec4(x, y, 0.0, 0.0);\n";
				break;
			case TESSPRIMITIVETYPE_ISOLINES:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half\n"
								 << "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
								 << "                             : vec4(x, y, 0.0, 0.0);\n";
				break;
			default:
				DE_ASSERT(false);
				return;
		}
	else
		tessEvalCoordSrc << "    ib_out.in_gs_tessCoord   = vec4(gl_TessCoord, 0.0);\n";

	const std::vector<Winding> windingCases      = getWindingCases(windingUsage);
	const std::vector<bool>    usePointModeCases = getUsePointModeCases(pointModeUsage);

	for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
	for (std::vector<bool>::const_iterator usePointModeIter = usePointModeCases.begin(); usePointModeIter != usePointModeCases.end(); ++usePointModeIter)
	{
		// Tessellation evaluation shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "\n"
				<< "layout(" << getTessPrimitiveTypeShaderName(primitiveType) << ", "
							 << getSpacingModeShaderName(spacingMode) << ", "
							 << getWindingShaderName(*windingIter)
							 << (*usePointModeIter ? ", point_mode" : "") << ") in;\n"
				<< "\n"
				<< "layout(location = 0) out " << perVertexInterfaceBlock << " ib_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< tessEvalCoordSrc.str()
				<< "    ib_out.in_gs_primitiveID = gl_PrimitiveID;\n"
				<< "}\n";

			programCollection.glslSources.add(getProgramName("tese", *windingIter, *usePointModeIter)) << glu::TessellationEvaluationSource(src.str());
		}
	}  // for windingNdx, usePointModeNdx

	// Geometry shader: data is captured here.
	{
		for (std::vector<bool>::const_iterator usePointModeIter = usePointModeCases.begin(); usePointModeIter != usePointModeCases.end(); ++usePointModeIter)
		{
			const int numVertices = numVerticesPerPrimitive(primitiveType, *usePointModeIter);  // Primitives that the tessellated patch comprises of.

			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_geometry_shader : require\n"
				<< "\n"
				<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(primitiveType, *usePointModeIter) << ") in;\n"
				<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(primitiveType, *usePointModeIter) << ", max_vertices = " << numVertices << ") out;\n"
				<< "\n"
				<< "layout(location = 0) in " << perVertexInterfaceBlock << " ib_in[];\n"
				<< "\n"
				<< "struct PerPrimitive {\n"
				<< "    int  patchPrimitiveID;\n"
				<< "    int  primitiveID;\n"
				<< "    vec4 tessCoord[3];\n"
				<< "};\n"
				<< "\n"
				<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
				<< "    int          numPrimitives;\n"
				<< "    PerPrimitive primitive[];\n"
				<< "} sb_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    int index = atomicAdd(sb_out.numPrimitives, 1);\n"
				<< "    sb_out.primitive[index].patchPrimitiveID = ib_in[0].in_gs_primitiveID;\n"
				<< "    sb_out.primitive[index].primitiveID      = index;\n";
			for (int i = 0; i < numVertices; ++i)
				src << "    sb_out.primitive[index].tessCoord[" << i << "]     = ib_in[" << i << "].in_gs_tessCoord;\n";
			for (int i = 0; i < numVertices; ++i)
				src << "\n"
					<< "    gl_Position = vec4(0.0);\n"
					<< "    EmitVertex();\n";
			src << "}\n";

			programCollection.glslSources.add(getProgramName("geom", *usePointModeIter)) << glu::GeometrySource(src.str());
		}
	}
}